

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_36::HttpClientAdapter::WebSocketResponseImpl::send
          (WebSocketResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  StringPtr **ppSVar1;
  char cVar2;
  Disposer *pDVar3;
  IdsByNameMap *pIVar4;
  _Hash_node_base *p_Var5;
  PromiseArena *pPVar6;
  PromiseArenaMember *node;
  OwnPromiseNode OVar7;
  char *pcVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  AsyncInputStream *pAVar13;
  undefined4 uVar14;
  OwnPromiseNode node_00;
  Header *pHVar15;
  void *pvVar16;
  undefined8 *puVar17;
  int __flags_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  HttpHeaderTable *pHVar19;
  StringPtr *__dest;
  undefined4 in_register_00000084;
  void *pvVar20;
  void *__arg;
  __fn *in_R9;
  TransformPromiseNodeBase *this_00;
  TransformPromiseNodeBase *this_01;
  IdsByNameMap **dependencyParam;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  String statusTextCopy;
  OneWayPipe pipe;
  OwnPromiseNode local_108;
  RemoveConst<kj::HttpHeaders::Header> *local_100;
  Header *pHStack_f8;
  OwnPromiseNode local_f0;
  String local_e8;
  undefined1 local_c8 [40];
  RemoveConst<kj::HttpHeaders::Header> *local_a0;
  Header *pHStack_98;
  char local_90;
  Array<char> *local_88;
  OneWayPipe local_68;
  Maybe<unsigned_long> local_48;
  OwnPromiseNode local_38;
  size_t sVar18;
  
  pvVar20 = (void *)CONCAT44(in_register_00000084,__flags);
  pHVar19 = (HttpHeaderTable *)CONCAT44(in_register_00000034,__fd);
  sVar18 = __n;
  __arg = pvVar20;
  heapString(&local_e8,(long)pvVar20 - 1);
  __flags_00 = (int)sVar18;
  pvVar16 = extraout_RDX;
  if ((long)pvVar20 - 1U != 0) {
    __dest = (StringPtr *)local_e8.content.size_;
    if ((StringPtr *)local_e8.content.size_ != (StringPtr *)0x0) {
      __dest = (StringPtr *)local_e8.content.ptr;
    }
    memcpy(__dest,(void *)__n,(long)pvVar20 - 1U);
    pvVar16 = extraout_RDX_00;
  }
  HttpHeaders::clone((HttpHeaders *)local_c8,in_R9,pvVar16,__flags_00,__arg);
  heap<kj::HttpHeaders>((kj *)&local_100,(HttpHeaders *)local_c8);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_c8);
  cVar2 = *(char *)&(headersCopy.disposer)->_vptr_Disposer;
  if (cVar2 == '\x01') {
    if (headersCopy.disposer[1]._vptr_Disposer == (_func_int **)0x0) {
      dependencyParam = &(pHVar19->idsByName).ptr;
      local_c8._8_4_ = (int)__buf;
      local_c8._16_8_ = local_e8.content.ptr;
      local_c8._24_8_ = local_e8.content.size_;
      local_c8._32_8_ = local_e8.content.disposer;
      local_e8.content.ptr = (char *)0x0;
      local_e8.content.size_ = 0;
      local_a0 = local_100;
      pHStack_98 = pHStack_f8;
      pHStack_f8 = (Header *)0x0;
      local_88 = (Array<char> *)headersCopy.disposer[1]._vptr_Disposer;
      pIVar4 = *dependencyParam;
      p_Var5 = (_Hash_node_base *)(pIVar4->map)._M_h._M_bucket_count;
      local_c8._0_8_ = pHVar19;
      local_90 = cVar2;
      if (p_Var5 == (_Hash_node_base *)0x0 || (ulong)((long)pIVar4 - (long)p_Var5) < 0x68) {
        pvVar16 = operator_new(0x400);
        this_00 = (TransformPromiseNodeBase *)((long)pvVar16 + 0x398);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,(OwnPromiseNode *)dependencyParam,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7054:26)>
                   ::anon_class_72_5_009bee8d_for_func::operator());
        *(undefined ***)((long)pvVar16 + 0x398) = &PTR_destroy_00705638;
        *(undefined8 *)((long)pvVar16 + 0x3b8) = local_c8._0_8_;
        *(undefined4 *)((long)pvVar16 + 0x3c0) = local_c8._8_4_;
        *(undefined8 *)((long)pvVar16 + 0x3c8) = local_c8._16_8_;
        *(undefined8 *)((long)pvVar16 + 0x3d0) = local_c8._24_8_;
        *(undefined8 *)((long)pvVar16 + 0x3d8) = local_c8._32_8_;
        *(RemoveConst<kj::HttpHeaders::Header> **)((long)pvVar16 + 0x3e0) = local_a0;
        *(Header **)((long)pvVar16 + 1000) = pHStack_98;
        *(char *)((long)pvVar16 + 0x3f0) = local_90;
        if (local_90 == '\x01') {
          *(Array<char> **)((long)pvVar16 + 0x3f8) = local_88;
          local_90 = '\0';
        }
        *(void **)((long)pvVar16 + 0x3a0) = pvVar16;
      }
      else {
        (pIVar4->map)._M_h._M_bucket_count = 0;
        this_00 = (TransformPromiseNodeBase *)&pIVar4[-2].map._M_h._M_bucket_count;
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,(OwnPromiseNode *)dependencyParam,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7054:26)>
                   ::anon_class_72_5_009bee8d_for_func::operator());
        pIVar4[-2].map._M_h._M_bucket_count = (size_type)&PTR_destroy_00705638;
        pIVar4[-2].map._M_h._M_rehash_policy._M_next_resize = local_c8._0_8_;
        *(undefined4 *)&pIVar4[-2].map._M_h._M_single_bucket = local_c8._8_4_;
        pIVar4[-1].map._M_h._M_buckets = (__buckets_ptr)local_c8._16_8_;
        pIVar4[-1].map._M_h._M_bucket_count = local_c8._24_8_;
        pIVar4[-1].map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_c8._32_8_;
        pIVar4[-1].map._M_h._M_element_count = (size_type)local_a0;
        *(Header **)&pIVar4[-1].map._M_h._M_rehash_policy = pHStack_98;
        *(char *)&pIVar4[-1].map._M_h._M_rehash_policy._M_next_resize = local_90;
        if (local_90 == '\x01') {
          pIVar4[-1].map._M_h._M_single_bucket = (__node_base_ptr)local_88;
          local_90 = '\0';
        }
        pIVar4[-2].map._M_h._M_before_begin._M_nxt = p_Var5;
      }
      pHStack_98 = (Header *)0x0;
      local_c8._24_8_ = (Header *)0x0;
      local_c8._16_8_ = (char *)0x0;
      pPVar6 = (this_00->super_PromiseNode).super_PromiseArenaMember.arena;
      local_108.ptr = &this_00->super_PromiseNode;
      if (pPVar6 == (PromiseArena *)0x0 || (ulong)((long)this_00 - (long)pPVar6) < 0x28) {
        pvVar16 = operator_new(0x400);
        this_01 = (TransformPromiseNodeBase *)((long)pvVar16 + 0x3d8);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_01,&local_108,kj::_::IdentityFunc<void>::operator());
        *(undefined ***)((long)pvVar16 + 0x3d8) = &PTR_destroy_00705690;
        *(void **)((long)pvVar16 + 0x3e0) = pvVar16;
      }
      else {
        (this_00->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
        this_01 = (TransformPromiseNodeBase *)&this_00[-2].continuationTracePtr;
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_01,&local_108,kj::_::IdentityFunc<void>::operator());
        this_00[-2].continuationTracePtr = &PTR_destroy_00705690;
        this_00[-1].super_PromiseNode.super_PromiseArenaMember._vptr_PromiseArenaMember =
             (_func_int **)pPVar6;
      }
      local_68.in.disposer = (Disposer *)0x5af2e6;
      local_68.in.ptr = (AsyncInputStream *)&DAT_00580f68;
      local_68.out.disposer = (Disposer *)0x1000001b8e;
      local_38.ptr = &this_01->super_PromiseNode;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&local_f0,&local_38,(SourceLocation *)&local_68);
      node_00.ptr = local_38.ptr;
      OVar7.ptr = local_f0.ptr;
      if ((TransformPromiseNodeBase *)local_38.ptr != (TransformPromiseNodeBase *)0x0) {
        local_38.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(node_00.ptr)->super_PromiseArenaMember);
      }
      node = (PromiseArenaMember *)*dependencyParam;
      *dependencyParam = (IdsByNameMap *)OVar7.ptr;
      if (node != (PromiseArenaMember *)0x0) {
        kj::_::PromiseDisposer::dispose(node);
      }
      OVar7.ptr = local_108.ptr;
      if ((TransformPromiseNodeBase *)local_108.ptr != (TransformPromiseNodeBase *)0x0) {
        local_108.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
      }
      if (pHStack_98 != (Header *)0x0) {
        pHStack_98 = (Header *)0x0;
        (**(code **)(local_a0->name).content.ptr)();
      }
      uVar11 = local_c8._24_8_;
      uVar10 = local_c8._16_8_;
      if ((char *)local_c8._16_8_ != (char *)0x0) {
        local_c8._16_8_ = (char *)0x0;
        local_c8._24_8_ = (Header *)0x0;
        (*(code *)((_Hash_node_base *)(((StringPtr *)local_c8._32_8_)->content).ptr)->_M_nxt)
                  (local_c8._32_8_,uVar10,1,uVar11,uVar11,0);
      }
      puVar17 = (undefined8 *)operator_new(0x10);
      *puVar17 = 0;
      puVar17[1] = 0;
      *puVar17 = &PTR_read_00709e80;
      puVar17[1] = &PTR_write_00709f18;
      (this->super_Response)._vptr_Response =
           (_func_int **)&kj::_::HeapDisposer<kj::NullStream>::instance;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)(puVar17 + 1);
      goto LAB_0043b493;
    }
    local_48.ptr.field_1 =
         *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(headersCopy.disposer + 1);
  }
  local_48.ptr.isSet = (bool)cVar2;
  newOneWayPipe(&local_68,&local_48);
  ppSVar1 = &(pHVar19->namesById).builder.endPtr;
  *(int *)ppSVar1 = *(int *)ppSVar1 + 1;
  local_c8._0_8_ = &(pHVar19->namesById).builder.pos;
  local_c8._8_8_ = pHVar19;
  Promise<void>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
            ((Promise<void> *)&local_f0,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
              *)&(pHVar19->idsByName).ptr);
  pHVar15 = (Header *)operator_new(0x28);
  uVar10 = local_c8._8_8_;
  OVar7.ptr = local_f0.ptr;
  uVar12 = local_68.in.ptr._0_4_;
  uVar14 = local_68.in.ptr._4_4_;
  local_68.in.ptr = (AsyncInputStream *)0x0;
  local_f0.ptr = (PromiseNode *)0x0;
  (pHVar15->name).content.ptr = (char *)&PTR_read_00705300;
  *(undefined4 *)&(pHVar15->name).content.size_ = local_68.in.disposer._0_4_;
  *(undefined4 *)((long)&(pHVar15->name).content.size_ + 4) = local_68.in.disposer._4_4_;
  *(undefined4 *)&(pHVar15->value).content.ptr = uVar12;
  *(undefined4 *)((long)&(pHVar15->value).content.ptr + 4) = uVar14;
  *(undefined1 *)&(pHVar15->value).content.size_ = 1;
  pHVar15[1].name.content.ptr = (char *)OVar7.ptr;
  if ((HttpHeaderTable *)local_c8._8_8_ != (HttpHeaderTable *)0x0) {
    local_c8._8_8_ = (StringPtr *)0x0;
    (*(code *)(((((Vector<kj::StringPtr> *)local_c8._0_8_)->builder).ptr)->content).ptr)
              (local_c8._0_8_,
               (char *)((long)&(((Vector<kj::StringPtr> *)uVar10)->builder).ptr +
                       (long)(((Vector<kj::StringPtr> *)uVar10)->builder).ptr[-1].content.ptr));
  }
  pDVar3 = (pHVar19->idsByName).disposer;
  local_c8._0_4_ = (int)__buf;
  local_c8._8_8_ = (StringPtr *)0x54bab9;
  if ((StringPtr *)local_e8.content.size_ != (StringPtr *)0x0) {
    local_c8._8_8_ = local_e8.content.ptr;
  }
  local_c8._16_8_ =
       (long)&((ArrayPtr<const_char> *)local_e8.content.size_)->ptr +
       (ulong)((StringPtr *)local_e8.content.size_ == (StringPtr *)0x0);
  local_c8._24_8_ = pHStack_f8;
  local_a0 = (RemoveConst<kj::HttpHeaders::Header> *)operator_new(0x40);
  (local_a0->name).content.ptr = (char *)&PTR___cxa_pure_virtual_006e1418;
  (local_a0->name).content.size_ = (size_t)local_100;
  (local_a0->value).content.ptr = (char *)pHStack_f8;
  pHStack_f8 = (Header *)0x0;
  (local_a0->value).content.size_ = (size_t)local_e8.content.ptr;
  local_a0[1].name.content.ptr = (char *)local_e8.content.size_;
  local_a0[1].name.content.size_ = (size_t)local_e8.content.disposer;
  local_e8.content.ptr = (char *)0x0;
  local_e8.content.size_ = 0;
  local_a0[1].value.content.ptr = "`Tp";
  local_a0[1].value.content.size_ = (size_t)pHVar15;
  (local_a0->name).content.ptr = (char *)&PTR_disposeImpl_007082c8;
  local_c8._32_4_ = 1;
  pHStack_98 = pHVar15;
  (*pDVar3->_vptr_Disposer[2])(pDVar3,local_c8);
  OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>::
  destroy((OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>
           *)(local_c8 + 0x20));
  pAVar13 = local_68.in.ptr;
  (this->super_Response)._vptr_Response = (_func_int **)local_68.out.disposer;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_68.out.ptr;
  local_68.out.ptr = (AsyncOutputStream *)0x0;
  if (local_68.in.ptr != (AsyncInputStream *)0x0) {
    local_68.in.ptr = (AsyncInputStream *)0x0;
    (**(local_68.in.disposer)->_vptr_Disposer)
              (local_68.in.disposer,
               (_func_int *)
               ((long)&pAVar13->_vptr_AsyncInputStream + (long)pAVar13->_vptr_AsyncInputStream[-2]))
    ;
  }
LAB_0043b493:
  if (pHStack_f8 != (Header *)0x0) {
    pHStack_f8 = (Header *)0x0;
    (**(code **)(local_100->name).content.ptr)();
  }
  sVar9 = local_e8.content.size_;
  pcVar8 = local_e8.content.ptr;
  if (local_e8.content.ptr != (char *)0x0) {
    local_e8.content.ptr = (char *)0x0;
    local_e8.content.size_ = 0;
    (*(code *)((_Hash_node_base *)
              (((StringPtr *)&(local_e8.content.disposer)->_vptr_ArrayDisposer)->content).ptr)->
              _M_nxt)(local_e8.content.disposer,pcVar8,1,sVar9,sVar9,0);
  }
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::Own<AsyncInputStream>(kj::heap<HeadResponseStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy)))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<kj::NullStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        kj::Own<AsyncInputStream> wrapper =
            kj::heap<DelayedEofInputStream>(kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }